

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

duration<long,_boost::ratio<1L,_1L>_> __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
::
getAssignment<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
           *this,matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 *cost_function,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map)

{
  ulong col_00;
  const_reference d;
  size_t col;
  size_t row;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  assignment_map_adapter;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map_local;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *cost_function_local;
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  *this_local;
  duration<long,_boost::ratio<1L,_1L>_> total_cost;
  
  assignment_map_adapter.assignment_map_ = assignment_map;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  AssignmentMapAdapter
            ((AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&row,assignment_map,*(unsigned_long *)this,*(unsigned_long *)(this + 8));
  this_local = *(HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                 **)(this + 0xe0);
  for (col = 0; col < *(ulong *)this; col = col + 1) {
    col_00 = hungarian_algorithm::HungarianSolverBase::findInRow
                       ((vector *)this,(ulong)(this + 0x88));
    if (col_00 < *(ulong *)(this + 8)) {
      AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::insert((AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)&row,col,col_00);
      d = boost::numeric::ublas::
          matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
          ::operator()(cost_function,col,col_00);
      boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::operator+=
                ((duration<long,_boost::ratio<1L,_1L>_> *)&this_local,d);
    }
  }
  return (duration<long,_boost::ratio<1L,_1L>_>)(rep)this_local;
}

Assistant:

Cost getAssignment(const CostFunction& cost_function, AssignmentMap& assignment_map)
  {
    // Fill assignment map and compute total cost of assignment:
    AssignmentMapAdapter<Size, AssignmentMap> assignment_map_adapter(assignment_map, num_rows_, num_cols_);
    Cost total_cost(zero_cost_);
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      const std::size_t col(findInRow(star_matrix_, row));
      if (col < num_cols_)
      {
        assignment_map_adapter.insert(Size(row), Size(col));
        total_cost += cost_function(Size(row), Size(col));
      }
    }
    return total_cost;
  }